

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O3

void __thiscall
proto2_nofieldpresence_unittest::TestProto2Required::~TestProto2Required(TestProto2Required *this)

{
  InternalMetadata *this_00;
  TestRequired *this_01;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this_01 = (this->field_0)._impl_.proto2_;
    if (this_01 != (TestRequired *)0x0) {
      proto2_unittest::TestRequired::~TestRequired(this_01);
    }
    operator_delete(this_01,0xa8);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_no_field_presence.pb.cc"
             ,0xe11,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestProto2Required::~TestProto2Required() {
  // @@protoc_insertion_point(destructor:proto2_nofieldpresence_unittest.TestProto2Required)
  SharedDtor(*this);
}